

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void convertToWithoutRowidTable(Parse *pParse,Table *pTab)

{
  ushort uVar1;
  short sVar2;
  u16 uVar3;
  sqlite3 *db;
  Vdbe *pVVar4;
  ExprList_item *pEVar5;
  Column *pCVar6;
  i16 *piVar7;
  bool bVar8;
  uint uVar9;
  ExprList *pList;
  char *pcVar10;
  Index *pIVar11;
  int iVar12;
  Op *pOVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  short *psVar17;
  short *psVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  Index *pIdx;
  char cVar23;
  
  db = pParse->db;
  pVVar4 = pParse->pVdbe;
  iVar12 = pParse->addrCrTab;
  if (iVar12 != 0) {
    if (iVar12 < 0) {
      iVar12 = pVVar4->nOp + -1;
    }
    if (pVVar4->db->mallocFailed == '\0') {
      pOVar13 = pVVar4->aOp + iVar12;
    }
    else {
      pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar13->opcode = 'x';
  }
  iVar12 = pParse->addrSkipPK;
  if (iVar12 != 0) {
    if (iVar12 < 0) {
      iVar12 = pVVar4->nOp + -1;
    }
    if (pVVar4->db->mallocFailed == '\0') {
      pOVar13 = pVVar4->aOp + iVar12;
    }
    else {
      pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar13->opcode = '\x10';
  }
  if (pTab->iPKey < 0) {
    for (pIdx = pTab->pIndex; (pIdx != (Index *)0x0 && ((pIdx->field_0x5b & 3) != 2));
        pIdx = pIdx->pNext) {
    }
    iVar12 = 1;
    if (1 < pIdx->nKeyCol) {
      psVar17 = pIdx->aiColumn;
      iVar12 = 1;
      uVar14 = 1;
      do {
        psVar18 = psVar17;
        iVar22 = iVar12;
        do {
          iVar20 = iVar22;
          if (iVar20 < 1) goto LAB_00155855;
          sVar2 = *psVar18;
          psVar18 = psVar18 + 1;
          iVar22 = iVar20 + -1;
        } while (sVar2 != psVar17[uVar14]);
        if (iVar20 < 1) {
LAB_00155855:
          lVar19 = (long)iVar12;
          iVar12 = iVar12 + 1;
          psVar17[lVar19] = psVar17[uVar14];
        }
        else {
          pIdx->nColumn = pIdx->nColumn - 1;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < pIdx->nKeyCol);
    }
    pIdx->nKeyCol = (u16)iVar12;
    goto LAB_00155870;
  }
  pIdx = (Index *)0x0;
  pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,(Expr *)0x0);
  if (pList == (ExprList *)0x0) {
LAB_001557e5:
    bVar8 = false;
  }
  else {
    pcVar10 = sqlite3DbStrDup(pParse->db,pTab->aCol[pTab->iPKey].zName);
    pEVar5 = pList->a;
    pEVar5->zName = pcVar10;
    pEVar5->sortOrder = pParse->iPkSortOrder;
    pIVar11 = sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,
                                 (uint)pTab->keyConf,(Token *)0x0,(Expr *)0x0,0,0);
    if (pIVar11 == (Index *)0x0) goto LAB_001557e5;
    pIVar11->field_0x5b = pIVar11->field_0x5b & 0xfc | 2;
    pTab->iPKey = -1;
    bVar8 = true;
    pIdx = pIVar11;
  }
  if (!bVar8) {
    return;
  }
LAB_00155870:
  pIdx->field_0x5b = pIdx->field_0x5b | 0x20;
  uVar1 = pIdx->nKeyCol;
  uVar14 = (ulong)uVar1;
  if ((db->init).imposterTable == '\0') {
    if (uVar14 != 0) {
      pCVar6 = pTab->aCol;
      piVar7 = pIdx->aiColumn;
      uVar15 = 0;
      do {
        pCVar6[piVar7[uVar15]].notNull = '\x01';
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    pIdx->field_0x5b = pIdx->field_0x5b | 8;
  }
  pIdx->tnum = pTab->tnum;
  for (pIVar11 = pTab->pIndex; pIVar11 != (Index *)0x0; pIVar11 = pIVar11->pNext) {
    cVar23 = '\n';
    if ((pIVar11->field_0x5b & 3) != 2) {
      if (uVar1 == 0) {
        iVar12 = 0;
      }
      else {
        uVar15 = 0;
        iVar12 = 0;
        do {
          psVar17 = pIVar11->aiColumn;
          uVar9 = (uint)pIVar11->nKeyCol;
          do {
            uVar16 = uVar9;
            if ((int)uVar16 < 1) break;
            sVar2 = *psVar17;
            psVar17 = psVar17 + 1;
            uVar9 = uVar16 - 1;
          } while (sVar2 != pIdx->aiColumn[uVar15]);
          iVar12 = iVar12 + (uint)((int)uVar16 < 1);
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar14);
      }
      if (iVar12 == 0) {
        pIVar11->nColumn = pIVar11->nKeyCol;
      }
      else {
        iVar12 = resizeIndexObject(db,pIVar11,iVar12 + (uint)pIVar11->nKeyCol);
        cVar23 = iVar12 != 0;
        if ((!(bool)cVar23) && (uVar1 != 0)) {
          uVar9 = (uint)pIVar11->nKeyCol;
          uVar15 = 0;
          do {
            psVar17 = pIVar11->aiColumn;
            uVar16 = (uint)pIVar11->nKeyCol;
            do {
              uVar21 = uVar16;
              if ((int)uVar21 < 1) goto LAB_001559a3;
              sVar2 = *psVar17;
              psVar17 = psVar17 + 1;
              uVar16 = uVar21 - 1;
            } while (sVar2 != pIdx->aiColumn[uVar15]);
            if ((int)uVar21 < 1) {
LAB_001559a3:
              pIVar11->aiColumn[(int)uVar9] = pIdx->aiColumn[uVar15];
              pIVar11->azColl[(int)uVar9] = pIdx->azColl[uVar15];
              uVar9 = uVar9 + 1;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar14);
          cVar23 = '\0';
        }
      }
    }
    if ((cVar23 != '\n') && (cVar23 != '\0')) {
      return;
    }
  }
  uVar3 = pTab->nCol;
  if ((int)(uint)uVar1 < (int)(short)uVar3) {
    iVar12 = resizeIndexObject(db,pIdx,(int)(short)uVar3);
    if ((iVar12 == 0) && (0 < pTab->nCol)) {
      iVar12 = 0;
      do {
        iVar22 = (int)uVar14;
        psVar17 = pIdx->aiColumn;
        uVar15 = uVar14;
        do {
          iVar20 = (int)uVar15;
          if (iVar20 < 1) goto LAB_00155a47;
          uVar15 = (ulong)(iVar20 - 1);
          sVar2 = *psVar17;
          psVar17 = psVar17 + 1;
        } while (iVar12 != sVar2);
        if (iVar20 < 1) {
LAB_00155a47:
          pIdx->aiColumn[iVar22] = (short)iVar12;
          pIdx->azColl[iVar22] = "BINARY";
          uVar14 = (ulong)(iVar22 + 1);
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < pTab->nCol);
    }
  }
  else {
    pIdx->nColumn = uVar3;
  }
  return;
}

Assistant:

static void convertToWithoutRowidTable(Parse *pParse, Table *pTab){
  Index *pIdx;
  Index *pPk;
  int nPk;
  int i, j;
  sqlite3 *db = pParse->db;
  Vdbe *v = pParse->pVdbe;

  /* Convert the OP_CreateTable opcode that would normally create the
  ** root-page for the table into an OP_CreateIndex opcode.  The index
  ** created will become the PRIMARY KEY index.
  */
  if( pParse->addrCrTab ){
    assert( v );
    sqlite3VdbeGetOp(v, pParse->addrCrTab)->opcode = OP_CreateIndex;
  }

  /* Bypass the creation of the PRIMARY KEY btree and the sqlite_master
  ** table entry.
  */
  if( pParse->addrSkipPK ){
    assert( v );
    sqlite3VdbeGetOp(v, pParse->addrSkipPK)->opcode = OP_Goto;
  }

  /* Locate the PRIMARY KEY index.  Or, if this table was originally
  ** an INTEGER PRIMARY KEY table, create a new PRIMARY KEY index. 
  */
  if( pTab->iPKey>=0 ){
    ExprList *pList;
    pList = sqlite3ExprListAppend(pParse, 0, 0);
    if( pList==0 ) return;
    pList->a[0].zName = sqlite3DbStrDup(pParse->db,
                                        pTab->aCol[pTab->iPKey].zName);
    pList->a[0].sortOrder = pParse->iPkSortOrder;
    assert( pParse->pNewTable==pTab );
    pPk = sqlite3CreateIndex(pParse, 0, 0, 0, pList, pTab->keyConf, 0, 0, 0, 0);
    if( pPk==0 ) return;
    pPk->idxType = SQLITE_IDXTYPE_PRIMARYKEY;
    pTab->iPKey = -1;
  }else{
    pPk = sqlite3PrimaryKeyIndex(pTab);
    /*
    ** Remove all redundant columns from the PRIMARY KEY.  For example, change
    ** "PRIMARY KEY(a,b,a,b,c,b,c,d)" into just "PRIMARY KEY(a,b,c,d)".  Later
    ** code assumes the PRIMARY KEY contains no repeated columns.
    */
    for(i=j=1; i<pPk->nKeyCol; i++){
      if( hasColumn(pPk->aiColumn, j, pPk->aiColumn[i]) ){
        pPk->nColumn--;
      }else{
        pPk->aiColumn[j++] = pPk->aiColumn[i];
      }
    }
    pPk->nKeyCol = j;
  }
  pPk->isCovering = 1;
  assert( pPk!=0 );
  nPk = pPk->nKeyCol;

  /* Make sure every column of the PRIMARY KEY is NOT NULL.  (Except,
  ** do not enforce this for imposter tables.) */
  if( !db->init.imposterTable ){
    for(i=0; i<nPk; i++){
      pTab->aCol[pPk->aiColumn[i]].notNull = 1;
    }
    pPk->uniqNotNull = 1;
  }

  /* The root page of the PRIMARY KEY is the table root page */
  pPk->tnum = pTab->tnum;

  /* Update the in-memory representation of all UNIQUE indices by converting
  ** the final rowid column into one or more columns of the PRIMARY KEY.
  */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int n;
    if( IsPrimaryKeyIndex(pIdx) ) continue;
    for(i=n=0; i<nPk; i++){
      if( !hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) ) n++;
    }
    if( n==0 ){
      /* This index is a superset of the primary key */
      pIdx->nColumn = pIdx->nKeyCol;
      continue;
    }
    if( resizeIndexObject(db, pIdx, pIdx->nKeyCol+n) ) return;
    for(i=0, j=pIdx->nKeyCol; i<nPk; i++){
      if( !hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) ){
        pIdx->aiColumn[j] = pPk->aiColumn[i];
        pIdx->azColl[j] = pPk->azColl[i];
        j++;
      }
    }
    assert( pIdx->nColumn>=pIdx->nKeyCol+n );
    assert( pIdx->nColumn>=j );
  }

  /* Add all table columns to the PRIMARY KEY index
  */
  if( nPk<pTab->nCol ){
    if( resizeIndexObject(db, pPk, pTab->nCol) ) return;
    for(i=0, j=nPk; i<pTab->nCol; i++){
      if( !hasColumn(pPk->aiColumn, j, i) ){
        assert( j<pPk->nColumn );
        pPk->aiColumn[j] = i;
        pPk->azColl[j] = "BINARY";
        j++;
      }
    }
    assert( pPk->nColumn==j );
    assert( pTab->nCol==j );
  }else{
    pPk->nColumn = pTab->nCol;
  }
}